

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::prim::PurposeEnumHandler
            (expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *tok)

{
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  error_type *peVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  size_t i;
  pointer ppVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  long lVar7;
  ulong uVar8;
  allocator local_1d2;
  allocator local_1d1;
  expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d0;
  vector<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
  enums;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0._0_4_ = 0;
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_error._M_string_length = (size_type)anon_var_dwarf_252708;
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0._16_4_ = 2;
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0._24_8_ = anon_var_dwarf_4cbd6e;
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._33_3_ = 0;
  enums.
  super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  enums.
  super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  enums.
  super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::pair<tinyusdz::Purpose,char_const*>,std::allocator<std::pair<tinyusdz::Purpose,char_const*>>>
  ::_M_range_initialize<std::pair<tinyusdz::Purpose,char_const*>const*>
            ((vector<std::pair<tinyusdz::Purpose,char_const*>,std::allocator<std::pair<tinyusdz::Purpose,char_const*>>>
              *)&enums,&ret);
  ::std::__cxx11::string::string((string *)&local_90,"purpose",&local_1d2);
  if (enums.
      super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      enums.
      super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = 0xffffffffffffffff;
LAB_001a95dc:
    uVar8 = uVar8 + 1;
    if (uVar8 < (ulong)((long)enums.
                              super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)enums.
                              super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4))
    goto code_r0x001a95fc;
    toks.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    toks.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    toks.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar7 = 8;
    local_1d0 = __return_storage_ptr__;
    for (pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
        v = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)enums.
                      super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)enums.
                      super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4), pvVar6 < v;
        pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&(pvVar6->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1)) {
      ::std::__cxx11::string::string
                ((string *)&ret,
                 *(char **)((long)&(enums.
                                    super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->first + lVar7),
                 (allocator *)&s);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toks,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
      ::std::__cxx11::string::_M_dispose();
      lVar7 = lVar7 + 0x10;
    }
    ::std::__cxx11::string::string((string *)&ret,", ",(allocator *)&local_e8);
    ::std::__cxx11::string::string((string *)&local_1a8,"\"",(allocator *)&local_108);
    quote((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_168,&toks,(string *)&local_1a8);
    join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&s,(tinyusdz *)&ret,(string *)&local_168,v);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::operator+(&local_b0,"Allowed tokens are [",&s);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0
                     ,"] but got ");
    ::std::__cxx11::string::string((string *)&local_50,"\"",&local_1d1);
    quote(&local_70,tok,&local_50);
    ::std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70
                    );
    ::std::operator+(&local_168,&local_e8,".");
    __return_storage_ptr__ = local_1d0;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p == &local_168.field_2) {
      local_1a8.field_2._8_8_ = local_168.field_2._8_8_;
    }
    else {
      local_1a8._M_dataplus._M_p = local_168._M_dataplus._M_p;
    }
    local_1a8.field_2._M_allocated_capacity._1_7_ = local_168.field_2._M_allocated_capacity._1_7_;
    local_1a8.field_2._M_local_buf[0] = local_168.field_2._M_local_buf[0];
    local_1a8._M_string_length = local_168._M_string_length;
    local_168._M_string_length = 0;
    local_168.field_2._M_local_buf[0] = '\0';
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&ret,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1a8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&toks);
    ppVar5 = enums.
             super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = enums.
             super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ret.contained.
         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._32_4_ & 1) != 0) goto LAB_001a962a;
    peVar4 = nonstd::expected_lite::
             expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error(&ret);
    ::std::__cxx11::string::string((string *)&s,(string *)peVar4);
    nonstd::expected_lite::
    expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&s);
    goto LAB_001a9a00;
  }
LAB_001a9610:
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = true;
  ppVar5 = enums.
           super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = enums.
           super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_001a962a:
  do {
    if (ppVar5 == ppVar1) {
      ::std::__cxx11::string::string((string *)&local_b0,"\"",(allocator *)&local_70);
      quote(&local_108,tok,&local_b0);
      ::std::operator+(&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_108," is an invalid token for attribute `");
      ::std::operator+(&local_168,&local_e8,&local_90);
      ::std::operator+(&local_1a8,&local_168,"`");
      s._M_dataplus._M_p = (pointer)&s.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) {
        s.field_2._8_8_ = local_1a8.field_2._8_8_;
      }
      else {
        s._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
      }
      s._M_string_length = local_1a8._M_string_length;
      local_1a8._M_string_length = 0;
      local_1a8.field_2._M_allocated_capacity =
           local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      nonstd::expected_lite::
      expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&s);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
LAB_001a9a00:
      ::std::__cxx11::string::_M_dispose();
LAB_001a9a05:
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
      ::std::__cxx11::string::_M_dispose();
      ::std::
      _Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
      ::~_Vector_base(&enums.
                       super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
                     );
      return __return_storage_ptr__;
    }
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              tok,ppVar5->second);
    if (bVar2) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = ppVar5->first;
      goto LAB_001a9a05;
    }
    ppVar5 = ppVar5 + 1;
  } while( true );
code_r0x001a95fc:
  iVar3 = ::std::__cxx11::string::compare((char *)tok);
  if (iVar3 == 0) goto LAB_001a9610;
  goto LAB_001a95dc;
}

Assistant:

static nonstd::expected<Purpose, std::string> PurposeEnumHandler(const std::string &tok) {
  using EnumTy = std::pair<Purpose, const char *>;
  const std::vector<EnumTy> enums = {
      std::make_pair(Purpose::Default, "default"),
      std::make_pair(Purpose::Proxy, "proxy"),
      std::make_pair(Purpose::Render, "render"),
      std::make_pair(Purpose::Guide, "guide"),
  };
  return EnumHandler<Purpose>("purpose", tok, enums);
}